

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entry_set(zip_t *zip,zip_entry_mark_t *entry_mark,size_t n,char **entries,size_t len)

{
  int iVar1;
  ssize_t err;
  size_t len_local;
  char **entries_local;
  size_t n_local;
  zip_entry_mark_t *entry_mark_local;
  zip_t *zip_local;
  
  zip_local = (zip_t *)zip_entry_mark(zip,entry_mark,n,entries,len);
  if (-1 < (long)zip_local) {
    iVar1 = zip_entry_finalize(zip,entry_mark,n);
    zip_local = (zip_t *)(long)iVar1;
    if (-1 < (long)zip_local) {
      zip_local = (zip_t *)0x0;
    }
  }
  return (ssize_t)zip_local;
}

Assistant:

static ssize_t zip_entry_set(struct zip_t *zip,
                             struct zip_entry_mark_t *entry_mark, size_t n,
                             char *const entries[], const size_t len) {
  ssize_t err = 0;

  if ((err = zip_entry_mark(zip, entry_mark, n, entries, len)) < 0) {
    return err;
  }
  if ((err = zip_entry_finalize(zip, entry_mark, n)) < 0) {
    return err;
  }
  return 0;
}